

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O3

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/object_object.cpp:389:52)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_object_object_cpp:389:52)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  bool bVar1;
  value *v;
  
  v = (value *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this->f);
  global_object::validate_object((global_object *)&stack0xffffffffffffffe0,v);
  bVar1 = anon_unknown_33::check_for_immutability
                    ((object_ptr *)&stack0xffffffffffffffe0,dont_delete|read_only);
  __return_storage_ptr__->type_ = boolean;
  (__return_storage_ptr__->field_1).b_ = bVar1;
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&stack0xffffffffffffffe0);
  return __return_storage_ptr__;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }